

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

void __thiscall ON_SubD::SwapDimple(ON_SubD *this,ON_SubDMeshImpl *subd_limple)

{
  element_type *peVar1;
  element_type *peVar2;
  undefined1 local_28 [8];
  shared_ptr<ON_SubDimple> limple_sp;
  ON_SubDMeshImpl *subd_limple_local;
  ON_SubD *this_local;
  
  limple_sp.super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)subd_limple;
  std::weak_ptr<ON_SubDimple>::lock((weak_ptr<ON_SubDimple> *)local_28);
  peVar1 = std::__shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->m_subdimple_sp).
                       super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>);
  peVar2 = std::__shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2> *)local_28);
  if (peVar1 != peVar2) {
    std::__shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>::swap
              (&(this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2> *)local_28);
    std::weak_ptr<ON_SubDimple>::operator=
              ((weak_ptr<ON_SubDimple> *)
               (limple_sp.super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi + 6),(shared_ptr<ON_SubDimple> *)local_28);
  }
  std::shared_ptr<ON_SubDimple>::~shared_ptr((shared_ptr<ON_SubDimple> *)local_28);
  return;
}

Assistant:

void ON_SubD::SwapDimple(class ON_SubDMeshImpl& subd_limple )
{
  std::shared_ptr <ON_SubDimple> limple_sp(subd_limple.m_subdimple_wp.lock());
  if (m_subdimple_sp.get() != limple_sp.get())
  {
    m_subdimple_sp.swap(limple_sp);
    subd_limple.m_subdimple_wp = limple_sp;
  }
}